

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O2

void __thiscall
FastPForLib::CompositeCodec<FastPForLib::PFor,_FastPForLib::VariableByte>::~CompositeCodec
          (CompositeCodec<FastPForLib::PFor,_FastPForLib::VariableByte> *this)

{
  ~CompositeCodec(this);
  operator_delete(this);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}